

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cap.cc
# Opt level: O0

S2Cap * __thiscall S2Cap::Expanded(S2Cap *__return_storage_ptr__,S2Cap *this,S1Angle distance)

{
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  S1ChordAngle local_68;
  S1ChordAngle local_60;
  double local_58;
  byte local_39;
  S2LogMessage local_38;
  S2LogMessageVoidify local_21;
  S2Cap *local_20;
  S2Cap *this_local;
  S1Angle distance_local;
  
  local_20 = this;
  this_local = (S2Cap *)distance.radians_;
  distance_local.radians_ = (double)__return_storage_ptr__;
  dVar3 = S1Angle::radians((S1Angle *)&this_local);
  local_39 = 0;
  if (dVar3 < 0.0) {
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_38,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2cap.cc"
               ,0x6d,kFatal,(ostream *)&std::cerr);
    local_39 = 1;
    poVar2 = S2LogMessage::stream(&local_38);
    poVar2 = std::operator<<(poVar2,"Check failed: (distance.radians()) >= (0) ");
    S2LogMessageVoidify::operator&(&local_21,poVar2);
  }
  if ((local_39 & 1) != 0) {
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_38);
  }
  bVar1 = is_empty(this);
  if (bVar1) {
    Empty();
  }
  else {
    local_60.length2_ = (this->radius_).length2_;
    S1ChordAngle::S1ChordAngle(&local_68,(S1Angle)this_local);
    local_58 = (double)::operator+(local_60,local_68);
    S2Cap(__return_storage_ptr__,&this->center_,(S1ChordAngle)local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

S2Cap S2Cap::Expanded(S1Angle distance) const {
  S2_DCHECK_GE(distance.radians(), 0);
  if (is_empty()) return Empty();
  return S2Cap(center_, radius_ + S1ChordAngle(distance));
}